

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O2

void Ssw_SmlSavePatternAig(Ssw_Man_t *p,int f)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pObj;
  uint i;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  for (i = 0; p_00 = p->pAig->vCis, (int)i < p_00->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    iVar1 = Ssw_ManGetSatVarValue(p,pObj,f);
    if (iVar1 != 0) {
      p->pPatWords[i >> 5] = p->pPatWords[i >> 5] | 1 << ((byte)i & 0x1f);
    }
  }
  return;
}

Assistant:

void Ssw_SmlSavePatternAig( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Aig_ManForEachCi( p->pAig, pObj, i )
        if ( Ssw_ManGetSatVarValue( p, pObj, f ) )
            Abc_InfoSetBit( p->pPatWords, i );
}